

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O0

void __thiscall o3dgc::Arithmetic_Codec::put_bit(Arithmetic_Codec *this,uint bit)

{
  uint uVar1;
  uint init_base;
  uint bit_local;
  Arithmetic_Codec *this_local;
  
  this->length = this->length >> 1;
  if ((bit != 0) && (uVar1 = this->base, this->base = this->length + this->base, this->base < uVar1)
     ) {
    propagate_carry(this);
  }
  if (this->length < 0x1000000) {
    renorm_enc_interval(this);
  }
  return;
}

Assistant:

void Arithmetic_Codec::put_bit(unsigned bit)
    {
    #ifdef _DEBUG
      if (mode != 1) AC_Error("encoder not initialized");
    #endif

      length >>= 1;                                              // halve interval
      if (bit) {
        unsigned init_base = base;
        base += length;                                               // move base
        if (init_base > base) propagate_carry();               // overflow = carry
      }

      if (length < AC__MinLength) renorm_enc_interval();        // renormalization
    }